

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

void Gia_ManCleanLevels(Gia_Man_t *p,int Size)

{
  Vec_Int_t *pVVar1;
  int Size_local;
  Gia_Man_t *p_local;
  
  if (p->vLevels == (Vec_Int_t *)0x0) {
    pVVar1 = Vec_IntAlloc(Size);
    p->vLevels = pVVar1;
  }
  Vec_IntFill(p->vLevels,Size,0);
  return;
}

Assistant:

void Gia_ManCleanLevels( Gia_Man_t * p, int Size )
{
    if ( p->vLevels == NULL )
        p->vLevels = Vec_IntAlloc( Size );
    Vec_IntFill( p->vLevels, Size, 0 );
}